

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenMiniReflect
          (CppGenerator *this,StructDef *struct_def,EnumDef *enum_def)

{
  pointer *ppuVar1;
  pointer *this_00;
  StructDef *def;
  EnumDef *def_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  char cVar6;
  _Rb_tree_header *p_Var7;
  reference type_00;
  difference_type dVar8;
  size_type_conflict sVar9;
  char **ppcVar10;
  reference pbVar11;
  reference puVar12;
  EnumVal *this_01;
  size_t sVar13;
  uint64_t uVar14;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar15;
  reference ppEVar16;
  reference ppFVar17;
  ulong uVar18;
  char *pcVar19;
  bool local_bc1;
  bool local_b0a;
  bool local_b09;
  int local_abc;
  BaseType local_ab8;
  size_type_conflict local_aa0;
  char *local_a88;
  EnumDef *local_a70;
  allocator<char> local_a49;
  string local_a48;
  allocator<char> local_a21;
  string local_a20;
  allocator<char> local_9f9;
  string local_9f8;
  allocator<char> local_9d1;
  string local_9d0;
  allocator<char> local_9a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  allocator<char> local_8e1;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  allocator<char> local_891;
  string local_890;
  allocator<char> local_869;
  string local_868;
  bool local_842;
  allocator<char> local_841;
  undefined1 local_840 [6];
  bool has_names;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  allocator<char> local_7c9;
  string local_7c8;
  allocator<char> local_7a1;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  allocator<char> local_751;
  string local_750;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  allocator<char> local_661;
  string local_660;
  allocator<char> local_639;
  string local_638;
  string local_618;
  string local_5f8;
  FieldDef *local_5d8;
  FieldDef *field_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range4;
  string local_598;
  EnumVal *local_578;
  EnumVal *ev_1;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_568;
  const_iterator it_1;
  undefined1 local_558 [7];
  bool consecutive_enum_from_zero;
  string vs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  reference local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  string ns;
  unsigned_short *array_size;
  iterator __end2_2;
  iterator __begin2_2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2_2;
  string as;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *type_ref;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string rs;
  string local_3d8;
  allocator<char> local_3b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  iterator rit;
  string local_2a8;
  byte local_283;
  byte local_282;
  allocator<char> local_281;
  string local_280;
  undefined1 local_260 [8];
  string ref_name;
  int ref_idx;
  int et;
  BaseType bt;
  bool is_array;
  bool is_vector;
  Type *type;
  iterator __end2;
  iterator __begin2;
  vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_> *__range2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> array_sizes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  type_refs;
  string ts;
  string local_1a0;
  EnumVal *local_180;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_170;
  const_iterator it;
  FieldDef **field;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range3;
  vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  allocator<char> local_d1;
  string local_d0;
  size_type_conflict local_b0;
  unsigned_long num_fields;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  EnumDef *local_20;
  EnumDef *enum_def_local;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  local_20 = enum_def;
  enum_def_local = (EnumDef *)struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"NAME",&local_41);
  if (enum_def_local == (EnumDef *)0x0) {
    local_a70 = local_20;
  }
  else {
    local_a70 = enum_def_local;
  }
  CodeWriter::SetValue(&this->code_,&local_40,(string *)local_a70);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"SEQ_TYPE",&local_79);
  if (enum_def_local == (EnumDef *)0x0) {
    local_a88 = "ST_ENUM";
    if ((local_20->is_union & 1U) != 0) {
      local_a88 = "ST_UNION";
    }
  }
  else {
    local_a88 = "ST_TABLE";
    if (((ulong)(enum_def_local->vals).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right &
        1) != 0) {
      local_a88 = "ST_STRUCT";
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,local_a88,(allocator<char> *)((long)&num_fields + 7));
  CodeWriter::SetValue(&this->code_,&local_78,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&num_fields + 7));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  if (enum_def_local == (EnumDef *)0x0) {
    local_aa0 = EnumDef::size(local_20);
  }
  else {
    local_aa0 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::size
                          ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                            *)&(enum_def_local->vals).dict._M_t._M_impl.super__Rb_tree_header);
  }
  local_b0 = local_aa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"NUM_FIELDS",&local_d1);
  NumToString<unsigned_long>
            ((string *)
             &names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_b0);
  CodeWriter::SetValue
            (&this->code_,&local_d0,
             (string *)
             &names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&types.super__Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>::vector
            ((vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_> *)&__range3);
  if (enum_def_local == (EnumDef *)0x0) {
    pvVar15 = EnumDef::Vals(local_20);
    local_170._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                   (pvVar15);
    while( true ) {
      pvVar15 = EnumDef::Vals(local_20);
      ev = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                     (pvVar15);
      bVar2 = __gnu_cxx::operator!=
                        (&local_170,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev);
      if (!bVar2) break;
      ppEVar16 = __gnu_cxx::
                 __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                 ::operator*(&local_170);
      local_180 = *ppEVar16;
      Name_abi_cxx11_(&local_1a0,this,local_180);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&types.
                      super__Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      if ((local_20->is_union & 1U) == 0) {
        ts.field_2._8_4_ = (local_20->underlying_type).base_type;
        ts.field_2._12_4_ = (local_20->underlying_type).element;
      }
      else {
        ts.field_2._8_4_ = (local_180->union_type).base_type;
        ts.field_2._12_4_ = (local_180->union_type).element;
      }
      std::vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>::push_back
                ((vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_> *)&__range3,
                 (value_type *)((long)&ts.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_170);
    }
  }
  else {
    p_Var7 = &(enum_def_local->vals).dict._M_t._M_impl.super__Rb_tree_header;
    __end3 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *
                        )p_Var7);
    field = (FieldDef **)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       p_Var7);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                       *)&field), bVar2) {
      ppFVar17 = __gnu_cxx::
                 __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                 ::operator*(&__end3);
      Name_abi_cxx11_((string *)&it,this,*ppFVar17);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&types.
                      super__Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&it);
      std::__cxx11::string::~string((string *)&it);
      std::vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>::push_back
                ((vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_> *)&__range3,
                 &((*ppFVar17)->value).type);
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&__end3);
    }
  }
  std::__cxx11::string::string
            ((string *)
             &type_refs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&array_sizes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&__range2);
  __end2 = std::vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>::begin
                     ((vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_> *)&__range3);
  type = (Type *)std::vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>::end
                           ((vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_> *)
                            &__range3);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<flatbuffers::Type_*,_std::vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>_>
                                *)&type);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&__range2_1);
      ppuVar1 = &array_sizes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)ppuVar1);
      type_ref = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ppuVar1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&type_ref), bVar2) {
        pbVar11 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
        uVar18 = std::__cxx11::string::empty();
        if ((uVar18 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&__range2_1,",\n    ");
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&as.field_2 + 8),pbVar11,"TypeTable");
        std::__cxx11::string::operator+=
                  ((string *)&__range2_1,(string *)(as.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(as.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
      std::__cxx11::string::string((string *)&__range2_2);
      __end2_2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&__range2);
      array_size = (unsigned_short *)
                   std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&__range2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                 *)&array_size), bVar2) {
        puVar12 = __gnu_cxx::
                  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  ::operator*(&__end2_2);
        NumToString<unsigned_short>((string *)((long)&ns.field_2 + 8),*puVar12);
        std::__cxx11::string::operator+=
                  ((string *)&__range2_2,(string *)(ns.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(ns.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)&__range2_2,", ");
        __gnu_cxx::
        __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
        ::operator++(&__end2_2);
      }
      std::__cxx11::string::string((string *)&__range2_3);
      this_00 = &types.super__Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      __end2_3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_00);
      name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_3,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&name), bVar2) {
        local_4f8 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2_3);
        uVar18 = std::__cxx11::string::empty();
        if ((uVar18 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&__range2_3,",\n    ");
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&vs.field_2 + 8),"\"",local_4f8);
        std::operator+(&local_518,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&vs.field_2 + 8),"\"");
        std::__cxx11::string::operator+=((string *)&__range2_3,(string *)&local_518);
        std::__cxx11::string::~string((string *)&local_518);
        std::__cxx11::string::~string((string *)(vs.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_3);
      }
      std::__cxx11::string::string((string *)local_558);
      local_b0a = false;
      if (local_20 != (EnumDef *)0x0) {
        this_01 = EnumDef::MinValue(local_20);
        bVar2 = EnumVal::IsZero(this_01);
        local_b0a = false;
        if (bVar2) {
          sVar13 = EnumDef::size(local_20);
          uVar14 = EnumDef::Distance(local_20);
          local_b0a = sVar13 - 1 == uVar14;
        }
      }
      it_1._M_current._7_1_ = local_b0a;
      if ((local_20 == (EnumDef *)0x0) || (local_b0a != false)) {
        if ((enum_def_local != (EnumDef *)0x0) &&
           (((ulong)(enum_def_local->vals).dict._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_right & 1) != 0)) {
          p_Var7 = &(enum_def_local->vals).dict._M_t._M_impl.super__Rb_tree_header;
          __end4 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                   begin((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          *)p_Var7);
          field_1 = (FieldDef *)
                    std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                    end((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *
                        )p_Var7);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                             *)&field_1), bVar2) {
            ppFVar17 = __gnu_cxx::
                       __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                       ::operator*(&__end4);
            local_5d8 = *ppFVar17;
            NumToString<unsigned_short>(&local_5f8,(local_5d8->value).offset);
            std::__cxx11::string::operator+=((string *)local_558,(string *)&local_5f8);
            std::__cxx11::string::~string((string *)&local_5f8);
            std::__cxx11::string::operator+=((string *)local_558,", ");
            __gnu_cxx::
            __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
            ::operator++(&__end4);
          }
          NumToString<unsigned_long>
                    (&local_618,
                     (unsigned_long)
                     (enum_def_local->vals).vec.
                     super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::operator+=((string *)local_558,(string *)&local_618);
          std::__cxx11::string::~string((string *)&local_618);
        }
      }
      else {
        pvVar15 = EnumDef::Vals(local_20);
        local_568._M_current =
             (EnumVal **)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                       (pvVar15);
        while( true ) {
          pvVar15 = EnumDef::Vals(local_20);
          ev_1 = (EnumVal *)
                 std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                           (pvVar15);
          bVar2 = __gnu_cxx::operator!=
                            (&local_568,
                             (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                              *)&ev_1);
          if (!bVar2) break;
          ppEVar16 = __gnu_cxx::
                     __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                     ::operator*(&local_568);
          local_578 = *ppEVar16;
          uVar18 = std::__cxx11::string::empty();
          if ((uVar18 & 1) == 0) {
            std::__cxx11::string::operator+=((string *)local_558,", ");
          }
          EnumDef::ToString_abi_cxx11_((string *)&__range4,local_20,local_578);
          NumToStringCpp(&local_598,(string *)&__range4,(local_20->underlying_type).base_type);
          std::__cxx11::string::operator+=((string *)local_558,(string *)&local_598);
          std::__cxx11::string::~string((string *)&local_598);
          std::__cxx11::string::~string((string *)&__range4);
          __gnu_cxx::
          __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
          ::operator++(&local_568);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"TYPES",&local_639);
      CodeWriter::SetValue
                (&this->code_,&local_638,
                 (string *)
                 &type_refs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_638);
      std::allocator<char>::~allocator(&local_639);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"REFS",&local_661);
      CodeWriter::SetValue(&this->code_,&local_660,(string *)&__range2_1);
      std::__cxx11::string::~string((string *)&local_660);
      std::allocator<char>::~allocator(&local_661);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_688,"ARRAYSIZES",&local_689);
      CodeWriter::SetValue(&this->code_,&local_688,(string *)&__range2_2);
      std::__cxx11::string::~string((string *)&local_688);
      std::allocator<char>::~allocator(&local_689);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"NAMES",&local_6b1);
      CodeWriter::SetValue(&this->code_,&local_6b0,(string *)&__range2_3);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::allocator<char>::~allocator(&local_6b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"VALUES",&local_6d9);
      CodeWriter::SetValue(&this->code_,&local_6d8,(string *)local_558);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::allocator<char>::~allocator(&local_6d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,"inline const ::flatbuffers::TypeTable *{{NAME}}TypeTable() {"
                 ,&local_701);
      CodeWriter::operator+=(&this->code_,&local_700);
      std::__cxx11::string::~string((string *)&local_700);
      std::allocator<char>::~allocator(&local_701);
      if (local_b0 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_728,"  static const ::flatbuffers::TypeCode type_codes[] = {",
                   &local_729);
        CodeWriter::operator+=(&this->code_,&local_728);
        std::__cxx11::string::~string((string *)&local_728);
        std::allocator<char>::~allocator(&local_729);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_750,"    {{TYPES}}",&local_751);
        CodeWriter::operator+=(&this->code_,&local_750);
        std::__cxx11::string::~string((string *)&local_750);
        std::allocator<char>::~allocator(&local_751);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"  };",&local_779);
        CodeWriter::operator+=(&this->code_,&local_778);
        std::__cxx11::string::~string((string *)&local_778);
        std::allocator<char>::~allocator(&local_779);
      }
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&array_sizes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7a0,"  static const ::flatbuffers::TypeFunction type_refs[] = {"
                   ,&local_7a1);
        CodeWriter::operator+=(&this->code_,&local_7a0);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::allocator<char>::~allocator(&local_7a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7c8,"    {{REFS}}",&local_7c9);
        CodeWriter::operator+=(&this->code_,&local_7c8);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::allocator<char>::~allocator(&local_7c9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"  };",&local_7f1);
        CodeWriter::operator+=(&this->code_,&local_7f0);
        std::__cxx11::string::~string((string *)&local_7f0);
        std::allocator<char>::~allocator(&local_7f1);
      }
      uVar18 = std::__cxx11::string::empty();
      if ((uVar18 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_818,"  static const int16_t array_sizes[] = { {{ARRAYSIZES}} };"
                   ,&local_819);
        CodeWriter::operator+=(&this->code_,&local_818);
        std::__cxx11::string::~string((string *)&local_818);
        std::allocator<char>::~allocator(&local_819);
      }
      uVar18 = std::__cxx11::string::empty();
      if ((uVar18 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_840,"  static const int64_t values[] = { {{VALUES}} };",
                   &local_841);
        CodeWriter::operator+=(&this->code_,(string *)local_840);
        std::__cxx11::string::~string((string *)local_840);
        std::allocator<char>::~allocator(&local_841);
      }
      local_bc1 = false;
      if (local_b0 != 0) {
        local_bc1 = (this->opts_).super_IDLOptions.mini_reflect == kTypesAndNames;
      }
      local_842 = local_bc1;
      if (local_bc1 != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_868,"  static const char * const names[] = {",&local_869);
        CodeWriter::operator+=(&this->code_,&local_868);
        std::__cxx11::string::~string((string *)&local_868);
        std::allocator<char>::~allocator(&local_869);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_890,"    {{NAMES}}",&local_891);
        CodeWriter::operator+=(&this->code_,&local_890);
        std::__cxx11::string::~string((string *)&local_890);
        std::allocator<char>::~allocator(&local_891);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"  };",&local_8b9);
        CodeWriter::operator+=(&this->code_,&local_8b8);
        std::__cxx11::string::~string((string *)&local_8b8);
        std::allocator<char>::~allocator(&local_8b9);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8e0,"  static const ::flatbuffers::TypeTable tt = {",&local_8e1);
      CodeWriter::operator+=(&this->code_,&local_8e0);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::allocator<char>::~allocator(&local_8e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9a8,"    ::flatbuffers::{{SEQ_TYPE}}, {{NUM_FIELDS}}, ",&local_9a9
                );
      pcVar19 = "nullptr, ";
      if (local_b0 != 0) {
        pcVar19 = "type_codes, ";
      }
      std::operator+(&local_988,&local_9a8,pcVar19);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&array_sizes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar19 = "type_refs, ";
      if (bVar2) {
        pcVar19 = "nullptr, ";
      }
      std::operator+(&local_968,&local_988,pcVar19);
      cVar6 = std::__cxx11::string::empty();
      pcVar19 = "array_sizes, ";
      if (cVar6 != '\0') {
        pcVar19 = "nullptr, ";
      }
      std::operator+(&local_948,&local_968,pcVar19);
      cVar6 = std::__cxx11::string::empty();
      pcVar19 = "values, ";
      if (cVar6 != '\0') {
        pcVar19 = "nullptr, ";
      }
      std::operator+(&local_928,&local_948,pcVar19);
      pcVar19 = "nullptr";
      if ((local_842 & 1U) != 0) {
        pcVar19 = "names";
      }
      std::operator+(&local_908,&local_928,pcVar19);
      CodeWriter::operator+=(&this->code_,&local_908);
      std::__cxx11::string::~string((string *)&local_908);
      std::__cxx11::string::~string((string *)&local_928);
      std::__cxx11::string::~string((string *)&local_948);
      std::__cxx11::string::~string((string *)&local_968);
      std::__cxx11::string::~string((string *)&local_988);
      std::__cxx11::string::~string((string *)&local_9a8);
      std::allocator<char>::~allocator(&local_9a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d0,"  };",&local_9d1);
      CodeWriter::operator+=(&this->code_,&local_9d0);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::allocator<char>::~allocator(&local_9d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9f8,"  return &tt;",&local_9f9);
      CodeWriter::operator+=(&this->code_,&local_9f8);
      std::__cxx11::string::~string((string *)&local_9f8);
      std::allocator<char>::~allocator(&local_9f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a20,"}",&local_a21);
      CodeWriter::operator+=(&this->code_,&local_a20);
      std::__cxx11::string::~string((string *)&local_a20);
      std::allocator<char>::~allocator(&local_a21);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a48,"",&local_a49);
      CodeWriter::operator+=(&this->code_,&local_a48);
      std::__cxx11::string::~string((string *)&local_a48);
      std::allocator<char>::~allocator(&local_a49);
      std::__cxx11::string::~string((string *)local_558);
      std::__cxx11::string::~string((string *)&__range2_3);
      std::__cxx11::string::~string((string *)&__range2_2);
      std::__cxx11::string::~string((string *)&__range2_1);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&__range2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&array_sizes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &type_refs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>::~vector
                ((vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_> *)&__range3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&types.super__Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    type_00 = __gnu_cxx::
              __normal_iterator<flatbuffers::Type_*,_std::vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>_>
              ::operator*(&__end2);
    uVar18 = std::__cxx11::string::empty();
    if ((uVar18 & 1) == 0) {
      std::__cxx11::string::operator+=
                ((string *)
                 &type_refs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,",\n    ");
    }
    bVar2 = IsVector(type_00);
    bVar3 = IsArray(type_00);
    if ((bVar2) || (bVar3)) {
      local_ab8 = type_00->element;
    }
    else {
      local_ab8 = type_00->base_type;
    }
    bVar4 = IsScalar(local_ab8);
    if ((bVar4) || (local_ab8 == BASE_TYPE_STRING)) {
      local_abc = local_ab8 - BASE_TYPE_UTYPE;
    }
    else {
      local_abc = 0xd;
    }
    ref_name.field_2._12_4_ = local_abc;
    ref_name.field_2._8_4_ = 0xffffffff;
    local_282 = 0;
    local_283 = 0;
    rit._M_current._6_1_ = 0;
    rit._M_current._5_1_ = 0;
    rit._M_current._3_1_ = 0;
    if (type_00->struct_def == (StructDef *)0x0) {
      if (type_00->enum_def == (EnumDef *)0x0) {
        std::allocator<char>::allocator();
        rit._M_current._3_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_260,"",(allocator<char> *)((long)&rit._M_current + 4));
      }
      else {
        def_00 = type_00->enum_def;
        std::allocator<char>::allocator();
        rit._M_current._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"",(allocator<char> *)((long)&rit._M_current + 7));
        rit._M_current._5_1_ = 1;
        BaseGenerator::WrapInNameSpace
                  ((string *)local_260,&this->super_BaseGenerator,&def_00->super_Definition,
                   &local_2a8);
      }
    }
    else {
      def = type_00->struct_def;
      std::allocator<char>::allocator();
      local_282 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"",&local_281);
      local_283 = 1;
      BaseGenerator::WrapInNameSpace
                ((string *)local_260,&this->super_BaseGenerator,&def->super_Definition,&local_280);
    }
    if ((rit._M_current._3_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&rit._M_current + 4));
    }
    if ((rit._M_current._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    if ((rit._M_current._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&rit._M_current + 7));
    }
    if ((local_283 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_280);
    }
    if ((local_282 & 1) != 0) {
      std::allocator<char>::~allocator(&local_281);
    }
    uVar18 = std::__cxx11::string::empty();
    if ((uVar18 & 1) == 0) {
      local_2b8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&array_sizes.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        local_2c0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&array_sizes.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
        bVar4 = __gnu_cxx::operator!=(&local_2b8,&local_2c0);
        if (!bVar4) break;
        pbVar11 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_2b8);
        _Var5 = std::operator==(pbVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_260);
        if (_Var5) {
          local_2c8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&array_sizes.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
          dVar8 = __gnu_cxx::operator-(&local_2b8,&local_2c8);
          ref_name.field_2._8_4_ = (undefined4)dVar8;
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2b8);
      }
      local_2d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&array_sizes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar4 = __gnu_cxx::operator==(&local_2b8,&local_2d0);
      if (bVar4) {
        ppuVar1 = &array_sizes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ppuVar1);
        ref_name.field_2._8_4_ = (undefined4)sVar9;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)ppuVar1,(value_type *)local_260);
      }
    }
    if (bVar3) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&__range2,
                 &type_00->fixed_length);
    }
    ppcVar10 = ElementaryTypeNames();
    pcVar19 = ppcVar10[(int)ref_name.field_2._12_4_];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,pcVar19,&local_3b1);
    std::operator+(&local_390,"{ ::flatbuffers::",&local_3b0);
    std::operator+(&local_370,&local_390,", ");
    local_b09 = true;
    if (!bVar2) {
      local_b09 = bVar3;
    }
    NumToString<bool>(&local_3d8,local_b09);
    std::operator+(&local_350,&local_370,&local_3d8);
    std::operator+(&local_330,&local_350,", ");
    NumToString<int>((string *)((long)&rs.field_2 + 8),ref_name.field_2._8_4_);
    std::operator+(&local_310,&local_330,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&rs.field_2 + 8));
    std::operator+(&local_2f0,&local_310," }");
    std::__cxx11::string::operator+=
              ((string *)
               &type_refs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)(rs.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
    std::__cxx11::string::~string((string *)local_260);
    __gnu_cxx::
    __normal_iterator<flatbuffers::Type_*,_std::vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void GenMiniReflect(const StructDef *struct_def, const EnumDef *enum_def) {
    code_.SetValue("NAME", struct_def ? struct_def->name : enum_def->name);
    code_.SetValue("SEQ_TYPE",
                   struct_def ? (struct_def->fixed ? "ST_STRUCT" : "ST_TABLE")
                              : (enum_def->is_union ? "ST_UNION" : "ST_ENUM"));
    auto num_fields =
        struct_def ? struct_def->fields.vec.size() : enum_def->size();
    code_.SetValue("NUM_FIELDS", NumToString(num_fields));
    std::vector<std::string> names;
    std::vector<Type> types;

    if (struct_def) {
      for (const auto &field : struct_def->fields.vec) {
        names.push_back(Name(*field));
        types.push_back(field->value.type);
      }
    } else {
      for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
           ++it) {
        const auto &ev = **it;
        names.push_back(Name(ev));
        types.push_back(enum_def->is_union ? ev.union_type
                                           : Type(enum_def->underlying_type));
      }
    }
    std::string ts;
    std::vector<std::string> type_refs;
    std::vector<uint16_t> array_sizes;
    for (auto &type : types) {
      if (!ts.empty()) ts += ",\n    ";
      auto is_vector = IsVector(type);
      auto is_array = IsArray(type);
      auto bt = is_vector || is_array ? type.element : type.base_type;
      auto et = IsScalar(bt) || bt == BASE_TYPE_STRING
                    ? bt - BASE_TYPE_UTYPE + ET_UTYPE
                    : ET_SEQUENCE;
      int ref_idx = -1;
      std::string ref_name = type.struct_def ? WrapInNameSpace(*type.struct_def)
                             : type.enum_def ? WrapInNameSpace(*type.enum_def)
                                             : "";
      if (!ref_name.empty()) {
        auto rit = type_refs.begin();
        for (; rit != type_refs.end(); ++rit) {
          if (*rit == ref_name) {
            ref_idx = static_cast<int>(rit - type_refs.begin());
            break;
          }
        }
        if (rit == type_refs.end()) {
          ref_idx = static_cast<int>(type_refs.size());
          type_refs.push_back(ref_name);
        }
      }
      if (is_array) { array_sizes.push_back(type.fixed_length); }
      ts += "{ ::flatbuffers::" + std::string(ElementaryTypeNames()[et]) +
            ", " + NumToString(is_vector || is_array) + ", " +
            NumToString(ref_idx) + " }";
    }
    std::string rs;
    for (auto &type_ref : type_refs) {
      if (!rs.empty()) rs += ",\n    ";
      rs += type_ref + "TypeTable";
    }
    std::string as;
    for (auto &array_size : array_sizes) {
      as += NumToString(array_size);
      as += ", ";
    }
    std::string ns;
    for (auto &name : names) {
      if (!ns.empty()) ns += ",\n    ";
      ns += "\"" + name + "\"";
    }
    std::string vs;
    const auto consecutive_enum_from_zero =
        enum_def && enum_def->MinValue()->IsZero() &&
        ((enum_def->size() - 1) == enum_def->Distance());
    if (enum_def && !consecutive_enum_from_zero) {
      for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
           ++it) {
        const auto &ev = **it;
        if (!vs.empty()) vs += ", ";
        vs += NumToStringCpp(enum_def->ToString(ev),
                             enum_def->underlying_type.base_type);
      }
    } else if (struct_def && struct_def->fixed) {
      for (const auto field : struct_def->fields.vec) {
        vs += NumToString(field->value.offset);
        vs += ", ";
      }
      vs += NumToString(struct_def->bytesize);
    }
    code_.SetValue("TYPES", ts);
    code_.SetValue("REFS", rs);
    code_.SetValue("ARRAYSIZES", as);
    code_.SetValue("NAMES", ns);
    code_.SetValue("VALUES", vs);
    code_ += "inline const ::flatbuffers::TypeTable *{{NAME}}TypeTable() {";
    if (num_fields) {
      code_ += "  static const ::flatbuffers::TypeCode type_codes[] = {";
      code_ += "    {{TYPES}}";
      code_ += "  };";
    }
    if (!type_refs.empty()) {
      code_ += "  static const ::flatbuffers::TypeFunction type_refs[] = {";
      code_ += "    {{REFS}}";
      code_ += "  };";
    }
    if (!as.empty()) {
      code_ += "  static const int16_t array_sizes[] = { {{ARRAYSIZES}} };";
    }
    if (!vs.empty()) {
      // Problem with uint64_t values greater than 9223372036854775807ULL.
      code_ += "  static const int64_t values[] = { {{VALUES}} };";
    }
    auto has_names =
        num_fields && opts_.mini_reflect == IDLOptions::kTypesAndNames;
    if (has_names) {
      code_ += "  static const char * const names[] = {";
      code_ += "    {{NAMES}}";
      code_ += "  };";
    }
    code_ += "  static const ::flatbuffers::TypeTable tt = {";
    code_ += std::string("    ::flatbuffers::{{SEQ_TYPE}}, {{NUM_FIELDS}}, ") +
             (num_fields ? "type_codes, " : "nullptr, ") +
             (!type_refs.empty() ? "type_refs, " : "nullptr, ") +
             (!as.empty() ? "array_sizes, " : "nullptr, ") +
             (!vs.empty() ? "values, " : "nullptr, ") +
             (has_names ? "names" : "nullptr");
    code_ += "  };";
    code_ += "  return &tt;";
    code_ += "}";
    code_ += "";
  }